

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

void * ShGetExecutable(ShHandle handle)

{
  long *plVar1;
  void *pvVar2;
  
  if (handle != (ShHandle)0x0) {
    plVar1 = (long *)(**(code **)(*handle + 0x18))();
    if (plVar1 != (long *)0x0) {
      pvVar2 = (void *)(**(code **)(*plVar1 + 0x68))(plVar1);
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

const void* ShGetExecutable(const ShHandle handle)
{
    if (handle == nullptr)
        return nullptr;

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(handle);

    TLinker* linker = static_cast<TLinker*>(base->getAsLinker());
    if (linker == nullptr)
        return nullptr;

    return linker->getObjectCode();
}